

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O2

void __thiscall
indk::Neuron::Entry::doAddSynapse(Entry *this,Position *SPos,uint Xm,float k1,int64_t Tl,int NT)

{
  Synapse *this_00;
  float _Lambda;
  Synapse *S;
  
  this_00 = (Synapse *)operator_new(0x60);
  _Lambda = Computer::getLambdaValue(Xm);
  Synapse::Synapse(this_00,SPos,k1,_Lambda,Tl,NT);
  S = this_00;
  std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::push_back
            (&this->Synapses,&S);
  return;
}

Assistant:

void indk::Neuron::Entry::doAddSynapse(indk::Position *SPos, unsigned int Xm, float k1, int64_t Tl, int NT) {
	auto *S = new Synapse(SPos, k1, indk::Computer::getLambdaValue(Xm), Tl, NT);
    Synapses.push_back(S);
}